

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRU.cpp
# Opt level: O3

void LruUnhitUnspace(void)

{
  ulong uVar1;
  unsigned_long uVar2;
  ulong uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  
  if (t_assoc == set_associative) {
    uVar2 = i_cache_set * current_set;
    uVar5 = LRU_priority[uVar2];
    uVar3 = (current_set + 1) * i_cache_set;
    i = uVar2;
    uVar4 = i_cache_set;
    temp = uVar5;
    if (uVar2 < uVar3) {
      do {
        uVar1 = LRU_priority[uVar2];
        if (uVar5 <= uVar1) {
          uVar5 = uVar1;
          j = uVar2;
          temp = uVar1;
        }
        uVar2 = uVar2 + 1;
        uVar4 = uVar4 - 1;
        i = uVar3;
      } while (uVar4 != 0);
    }
  }
  else {
    if (t_assoc != full_associative) {
      return;
    }
    temp = LRU_priority[0];
    i = i_num_line;
    if (i_num_line != 0) {
      uVar5 = 0;
      uVar3 = LRU_priority[0];
      do {
        uVar1 = LRU_priority[uVar5];
        if (uVar3 <= uVar1) {
          uVar3 = uVar1;
          j = uVar5;
          temp = uVar1;
        }
        uVar5 = uVar5 + 1;
      } while (i_num_line != uVar5);
    }
  }
  current_line = j;
  return;
}

Assistant:

void LruUnhitUnspace()
{
    if(t_assoc == full_associative)
    {
        temp = LRU_priority[0];

        for(i=0; i<i_num_line; i++)
        {
            if(LRU_priority[i]>=temp)
            {
                temp = LRU_priority[i];
                j = i;
            }
        }

        current_line = j;
    }

    if(t_assoc == set_associative)
    {
        temp = LRU_priority[current_set*i_cache_set];

        for(i=(current_set*i_cache_set); i<((current_set+1)*i_cache_set); i++)
        {
            if(LRU_priority[i]>=temp)
            {
                temp = LRU_priority[i];
                j = i;
            }
        }

        current_line = j;
    }
}